

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.cpp
# Opt level: O2

NodeRecord * __thiscall
embree::sse2::CreateMortonLeaf<4,_embree::InstanceArrayPrimitive>::operator()
          (NodeRecord *__return_storage_ptr__,
          CreateMortonLeaf<4,_embree::InstanceArrayPrimitive> *this,range<unsigned_int> *current,
          CachedAllocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  float *pfVar2;
  uint uVar3;
  uint uVar4;
  RTCFormat RVar5;
  uint uVar6;
  FastAllocator *this_00;
  ThreadLocal *pTVar7;
  ThreadLocal2 *this_01;
  InstanceArray *this_02;
  RawBufferView *pRVar8;
  char *pcVar9;
  MutexSys *pMVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  MutexSys *pMVar24;
  Accel *pAVar25;
  size_t sVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  char *pcVar30;
  undefined1 in_XMM0 [16];
  undefined1 extraout_XMM0 [16];
  undefined1 extraout_XMM0_00 [16];
  undefined1 extraout_XMM0_01 [16];
  undefined1 extraout_XMM0_02 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar31 [16];
  float fVar32;
  undefined1 auVar33 [16];
  float fVar36;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar37;
  float fVar42;
  float fVar43;
  undefined1 auVar38 [16];
  float fVar44;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar41;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float in_XMM10_Da;
  float in_XMM10_Db;
  float in_XMM10_Dc;
  float in_XMM10_Dd;
  float in_XMM11_Da;
  float in_XMM11_Db;
  float in_XMM11_Dc;
  float in_XMM11_Dd;
  float in_XMM12_Da;
  float in_XMM12_Db;
  float in_XMM12_Dc;
  float in_XMM12_Dd;
  float in_XMM13_Da;
  float in_XMM13_Db;
  float in_XMM13_Dc;
  float in_XMM13_Dd;
  Lock<embree::MutexSys> local_168;
  ulong local_158;
  MutexSys *local_150;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  range<unsigned_int> *local_f0;
  NodeRecord *local_e8;
  Lock<embree::MutexSys> local_e0;
  ThreadLocal2 *local_d0;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_a8;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  uVar3 = current->_begin;
  local_158 = (ulong)(current->_end - uVar3);
  local_150 = (MutexSys *)(local_158 * 8);
  this_00 = alloc->alloc;
  pTVar7 = alloc->talloc1;
  this_01 = pTVar7->parent;
  local_f0 = current;
  local_e8 = __return_storage_ptr__;
  if (this_00 != (this_01->alloc)._M_b._M_p) {
    local_e0.locked = true;
    local_e0.mutex = &this_01->mutex;
    MutexSys::lock(&this_01->mutex);
    if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_01->alloc0).end + (this_01->alloc1).end) -
           ((this_01->alloc0).cur + (this_01->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_01->alloc0).bytesUsed = 0;
    (this_01->alloc0).bytesWasted = 0;
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    (this_01->alloc0).ptr = (char *)0x0;
    (this_01->alloc0).cur = 0;
    if (this_00 == (FastAllocator *)0x0) {
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
    }
    else {
      (this_01->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (this_01->alloc)._M_b._M_p = this_00;
    UNLOCK();
    local_168.mutex = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
    local_168.locked = true;
    local_d0 = this_01;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    std::
    vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ::push_back(&this_00->thread_local_allocators,&local_d0);
    Lock<embree::MutexSys>::~Lock(&local_168);
    Lock<embree::MutexSys>::~Lock(&local_e0);
    in_XMM0 = extraout_XMM0;
  }
  pMVar24 = local_150;
  pTVar7->bytesUsed = (long)&local_150->mutex + pTVar7->bytesUsed;
  sVar26 = pTVar7->cur;
  uVar28 = (ulong)(-(int)sVar26 & 0xf);
  uVar29 = (long)&local_150->mutex + uVar28 + sVar26;
  pTVar7->cur = uVar29;
  if (pTVar7->end < uVar29) {
    pTVar7->cur = sVar26;
    pMVar10 = (MutexSys *)pTVar7->allocBlockSize;
    if ((MutexSys *)((long)local_150 * 4) < pMVar10 || (long)local_150 * 4 - (long)pMVar10 == 0) {
      local_168.mutex = pMVar10;
      pcVar30 = (char *)FastAllocator::malloc(this_00,(size_t)&local_168);
      pTVar7->ptr = pcVar30;
      sVar26 = (pTVar7->end - pTVar7->cur) + pTVar7->bytesWasted;
      pTVar7->bytesWasted = sVar26;
      pTVar7->end = (size_t)local_168.mutex;
      pTVar7->cur = (size_t)pMVar24;
      in_XMM0 = extraout_XMM0_01;
      if (local_168.mutex < pMVar24) {
        pTVar7->cur = 0;
        local_168.mutex = (MutexSys *)pTVar7->allocBlockSize;
        pcVar30 = (char *)FastAllocator::malloc(this_00,(size_t)&local_168);
        pTVar7->ptr = pcVar30;
        sVar26 = (pTVar7->end - pTVar7->cur) + pTVar7->bytesWasted;
        pTVar7->bytesWasted = sVar26;
        pTVar7->end = (size_t)local_168.mutex;
        pTVar7->cur = (size_t)pMVar24;
        in_XMM0 = extraout_XMM0_02;
        if (local_168.mutex < pMVar24) {
          pTVar7->cur = 0;
          pcVar30 = (char *)0x0;
          local_108 = in_XMM10_Da;
          fStack_104 = in_XMM10_Db;
          fStack_100 = in_XMM10_Dc;
          fStack_fc = in_XMM10_Dd;
          local_118 = in_XMM11_Da;
          fStack_114 = in_XMM11_Db;
          fStack_110 = in_XMM11_Dc;
          fStack_10c = in_XMM11_Dd;
          local_128 = in_XMM12_Da;
          fStack_124 = in_XMM12_Db;
          fStack_120 = in_XMM12_Dc;
          fStack_11c = in_XMM12_Dd;
          local_138 = in_XMM13_Da;
          fStack_134 = in_XMM13_Db;
          fStack_130 = in_XMM13_Dc;
          fStack_12c = in_XMM13_Dd;
          goto LAB_00467e6b;
        }
      }
      pTVar7->bytesWasted = sVar26;
      local_108 = in_XMM10_Da;
      fStack_104 = in_XMM10_Db;
      fStack_100 = in_XMM10_Dc;
      fStack_fc = in_XMM10_Dd;
      local_118 = in_XMM11_Da;
      fStack_114 = in_XMM11_Db;
      fStack_110 = in_XMM11_Dc;
      fStack_10c = in_XMM11_Dd;
      local_128 = in_XMM12_Da;
      fStack_124 = in_XMM12_Db;
      fStack_120 = in_XMM12_Dc;
      fStack_11c = in_XMM12_Dd;
      local_138 = in_XMM13_Da;
      fStack_134 = in_XMM13_Db;
      fStack_130 = in_XMM13_Dc;
      fStack_12c = in_XMM13_Dd;
    }
    else {
      pcVar30 = (char *)FastAllocator::malloc(this_00,(size_t)&local_150);
      in_XMM0 = extraout_XMM0_00;
      local_108 = in_XMM10_Da;
      fStack_104 = in_XMM10_Db;
      fStack_100 = in_XMM10_Dc;
      fStack_fc = in_XMM10_Dd;
      local_118 = in_XMM11_Da;
      fStack_114 = in_XMM11_Db;
      fStack_110 = in_XMM11_Dc;
      fStack_10c = in_XMM11_Dd;
      local_128 = in_XMM12_Da;
      fStack_124 = in_XMM12_Db;
      fStack_120 = in_XMM12_Dc;
      fStack_11c = in_XMM12_Dd;
      local_138 = in_XMM13_Da;
      fStack_134 = in_XMM13_Db;
      fStack_130 = in_XMM13_Dc;
      fStack_12c = in_XMM13_Dd;
    }
  }
  else {
    pTVar7->bytesWasted = pTVar7->bytesWasted + uVar28;
    pcVar30 = pTVar7->ptr + (uVar29 - (long)local_150);
    local_108 = in_XMM10_Da;
    fStack_104 = in_XMM10_Db;
    fStack_100 = in_XMM10_Dc;
    fStack_fc = in_XMM10_Dd;
    local_118 = in_XMM11_Da;
    fStack_114 = in_XMM11_Db;
    fStack_110 = in_XMM11_Dc;
    fStack_10c = in_XMM11_Dd;
    local_128 = in_XMM12_Da;
    fStack_124 = in_XMM12_Db;
    fStack_120 = in_XMM12_Dc;
    fStack_11c = in_XMM12_Dd;
    local_138 = in_XMM13_Da;
    fStack_134 = in_XMM13_Db;
    fStack_130 = in_XMM13_Dc;
    fStack_12c = in_XMM13_Dd;
  }
LAB_00467e6b:
  this_02 = this->mesh;
  local_a8 = _DAT_01f45a40;
  local_b8 = _DAT_01f45a30;
  for (uVar28 = 0; local_158 != uVar28; uVar28 = uVar28 + 1) {
    uVar4 = this->morton[uVar3 + uVar28].field_0.field_0.index;
    uVar29 = (ulong)uVar4;
    if ((*(long *)&(this_02->super_Geometry).field_0x58 != 0) ||
       (*(int *)((this_02->object_ids).super_RawBufferView.ptr_ofs +
                (this_02->object_ids).super_RawBufferView.stride * uVar29) != -1)) {
      pRVar8 = (this_02->l2w_buf).items;
      RVar5 = pRVar8->format;
      if ((this_02->super_Geometry).field_8.field_0x1 == '\x01') {
        if (RVar5 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
          pcVar9 = pRVar8->ptr_ofs;
          lVar27 = pRVar8->stride * uVar29;
          fStack_74 = *(float *)(pcVar9 + lVar27 + 0x10);
          local_78 = *(float *)(pcVar9 + lVar27);
          local_c8 = *(float *)(pcVar9 + lVar27 + 4);
          local_88 = *(float *)(pcVar9 + lVar27 + 8);
          local_98 = *(float *)(pcVar9 + lVar27 + 0xc);
          fStack_70 = *(float *)(pcVar9 + lVar27 + 0x20);
          fStack_6c = 0.0;
          fStack_c4 = *(float *)(pcVar9 + lVar27 + 0x14);
          fStack_c0 = *(float *)(pcVar9 + lVar27 + 0x24);
          fStack_bc = 0.0;
          fStack_84 = *(float *)(pcVar9 + lVar27 + 0x18);
          fStack_80 = *(float *)(pcVar9 + lVar27 + 0x28);
          fStack_7c = 0.0;
          fStack_94 = *(float *)(pcVar9 + lVar27 + 0x1c);
          fStack_90 = *(float *)(pcVar9 + lVar27 + 0x2c);
          fStack_8c = 0.0;
        }
        else if (RVar5 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
          pcVar9 = pRVar8->ptr_ofs;
          lVar27 = pRVar8->stride * uVar29;
          local_78 = *(float *)(pcVar9 + lVar27);
          fStack_74 = (float)*(undefined8 *)(pcVar9 + lVar27 + 4);
          fStack_70 = (float)((ulong)*(undefined8 *)(pcVar9 + lVar27 + 4) >> 0x20);
          fStack_6c = 0.0;
          local_c8 = *(float *)(pcVar9 + lVar27 + 0xc);
          fStack_c4 = (float)*(undefined8 *)(pcVar9 + lVar27 + 0x10);
          fStack_c0 = (float)((ulong)*(undefined8 *)(pcVar9 + lVar27 + 0x10) >> 0x20);
          fStack_bc = 0.0;
          local_88 = *(float *)(pcVar9 + lVar27 + 0x18);
          fStack_84 = (float)*(undefined8 *)(pcVar9 + lVar27 + 0x1c);
          fStack_80 = (float)((ulong)*(undefined8 *)(pcVar9 + lVar27 + 0x1c) >> 0x20);
          fStack_7c = 0.0;
          local_98 = *(float *)(pcVar9 + lVar27 + 0x24);
          fStack_94 = (float)*(undefined8 *)(pcVar9 + lVar27 + 0x28);
          fStack_90 = (float)((ulong)*(undefined8 *)(pcVar9 + lVar27 + 0x28) >> 0x20);
          fStack_8c = 0.0;
        }
        else if (RVar5 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
          pcVar9 = pRVar8->ptr_ofs;
          lVar27 = pRVar8->stride * uVar29;
          local_88 = (float)*(undefined8 *)(pcVar9 + lVar27 + 0x10);
          fStack_84 = (float)((ulong)*(undefined8 *)(pcVar9 + lVar27 + 0x10) >> 0x20);
          local_78 = *(float *)(pcVar9 + lVar27);
          fStack_c4 = *(float *)(pcVar9 + lVar27 + 4);
          fStack_80 = *(float *)(pcVar9 + lVar27 + 8);
          local_c8 = *(float *)(pcVar9 + lVar27 + 0xc);
          fStack_74 = (float)*(undefined8 *)(pcVar9 + lVar27 + 0x34);
          fStack_70 = (float)((ulong)*(undefined8 *)(pcVar9 + lVar27 + 0x34) >> 0x20);
          local_98 = *(float *)(pcVar9 + lVar27 + 0x18);
          fStack_94 = (float)*(undefined8 *)(pcVar9 + lVar27 + 0x1c);
          fStack_90 = (float)((ulong)*(undefined8 *)(pcVar9 + lVar27 + 0x1c) >> 0x20);
          fVar36 = *(float *)(pcVar9 + lVar27 + 0x24);
          fVar32 = *(float *)(pcVar9 + lVar27 + 0x28);
          fVar65 = *(float *)(pcVar9 + lVar27 + 0x2c);
          fVar52 = *(float *)(pcVar9 + lVar27 + 0x30);
          fVar48 = fVar52 * fVar52 + fVar65 * fVar65 + fVar36 * fVar36 + fVar32 * fVar32;
          auVar38 = rsqrtss(ZEXT416((uint)fVar48),ZEXT416((uint)fVar48));
          fVar37 = auVar38._0_4_;
          fVar37 = fVar37 * fVar37 * fVar48 * -0.5 * fVar37 + fVar37 * 1.5;
          fStack_8c = fVar36 * fVar37;
          fStack_6c = fVar32 * fVar37;
          fStack_bc = fVar65 * fVar37;
          fStack_7c = fVar37 * fVar52;
          fStack_c0 = *(float *)(pcVar9 + lVar27 + 0x3c);
        }
        else if (RVar5 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
          pcVar9 = pRVar8->ptr_ofs;
          lVar27 = pRVar8->stride * uVar29;
          pfVar2 = (float *)(pcVar9 + lVar27);
          local_78 = *pfVar2;
          fStack_74 = pfVar2[1];
          fStack_70 = pfVar2[2];
          fStack_6c = pfVar2[3];
          pfVar2 = (float *)(pcVar9 + lVar27 + 0x10);
          local_c8 = *pfVar2;
          fStack_c4 = pfVar2[1];
          fStack_c0 = pfVar2[2];
          fStack_bc = pfVar2[3];
          pfVar2 = (float *)(pcVar9 + lVar27 + 0x20);
          local_88 = *pfVar2;
          fStack_84 = pfVar2[1];
          fStack_80 = pfVar2[2];
          fStack_7c = pfVar2[3];
          pfVar2 = (float *)(pcVar9 + lVar27 + 0x30);
          local_98 = *pfVar2;
          fStack_94 = pfVar2[1];
          fStack_90 = pfVar2[2];
          fStack_8c = pfVar2[3];
        }
        fVar65 = fStack_6c * fStack_bc + fStack_7c * fStack_8c;
        fVar36 = fStack_6c * fStack_bc - fStack_7c * fStack_8c;
        fVar32 = fStack_8c * fStack_8c + fStack_6c * fStack_6c + -fStack_bc * fStack_bc +
                 -fStack_7c * fStack_7c;
        fVar52 = fStack_8c * fStack_8c - fStack_6c * fStack_6c;
        fVar45 = fStack_bc * fStack_bc + fVar52 + -fStack_7c * fStack_7c;
        fVar43 = fStack_6c * fStack_7c - fStack_bc * fStack_8c;
        fVar44 = fStack_bc * fStack_8c + fStack_6c * fStack_7c;
        fVar46 = fStack_bc * fStack_7c + fStack_6c * fStack_8c;
        fVar49 = fStack_bc * fStack_7c - fStack_6c * fStack_8c;
        fVar50 = fStack_7c * fStack_7c + fVar52 + -fStack_bc * fStack_bc;
        fVar65 = fVar65 + fVar65;
        fVar43 = fVar43 + fVar43;
        fVar36 = fVar36 + fVar36;
        fVar46 = fVar46 + fVar46;
        fVar44 = fVar44 + fVar44;
        fVar49 = fVar49 + fVar49;
        fVar37 = fVar32 * 1.0 + fVar65 * 0.0 + fVar43 * 0.0;
        fVar48 = fVar32 * 0.0 + fVar65 * 1.0 + fVar43 * 0.0;
        fVar42 = fVar32 * 0.0 + fVar65 * 0.0 + fVar43 * 1.0;
        fVar43 = fVar32 * 0.0 + fVar65 * 0.0 + fVar43 * 0.0;
        fVar32 = fVar36 * 1.0 + fVar45 * 0.0 + fVar46 * 0.0;
        fVar65 = fVar36 * 0.0 + fVar45 * 1.0 + fVar46 * 0.0;
        fVar52 = fVar36 * 0.0 + fVar45 * 0.0 + fVar46 * 1.0;
        fVar36 = fVar36 * 0.0 + fVar45 * 0.0 + fVar46 * 0.0;
        fVar45 = fVar44 * 1.0 + fVar49 * 0.0 + fVar50 * 0.0;
        fVar46 = fVar44 * 0.0 + fVar49 * 1.0 + fVar50 * 0.0;
        fVar47 = fVar44 * 0.0 + fVar49 * 0.0 + fVar50 * 1.0;
        fVar44 = fVar44 * 0.0 + fVar49 * 0.0 + fVar50 * 0.0;
        local_48 = local_78 * fVar37 + fVar32 * 0.0 + fVar45 * 0.0;
        fStack_44 = local_78 * fVar48 + fVar65 * 0.0 + fVar46 * 0.0;
        fStack_40 = local_78 * fVar42 + fVar52 * 0.0 + fVar47 * 0.0;
        fStack_3c = local_78 * fVar43 + fVar36 * 0.0 + fVar44 * 0.0;
        local_58 = local_c8 * fVar37 + fStack_c4 * fVar32 + fVar45 * 0.0;
        fStack_54 = local_c8 * fVar48 + fStack_c4 * fVar65 + fVar46 * 0.0;
        fStack_50 = local_c8 * fVar42 + fStack_c4 * fVar52 + fVar47 * 0.0;
        fStack_4c = local_c8 * fVar43 + fStack_c4 * fVar36 + fVar44 * 0.0;
        local_68 = local_88 * fVar37 + fStack_84 * fVar32 + fStack_80 * fVar45;
        fStack_64 = local_88 * fVar48 + fStack_84 * fVar65 + fStack_80 * fVar46;
        fStack_60 = local_88 * fVar42 + fStack_84 * fVar52 + fStack_80 * fVar47;
        fStack_5c = local_88 * fVar43 + fStack_84 * fVar36 + fStack_80 * fVar44;
        fStack_144 = local_98 * fVar48 + fStack_94 * fVar65 + fStack_90 * fVar46 + fStack_70 + 0.0;
        local_148 = local_98 * fVar37 + fStack_94 * fVar32 + fStack_90 * fVar45 + fStack_74 + 0.0;
        fStack_140 = local_98 * fVar42 + fStack_94 * fVar52 + fStack_90 * fVar47 + fStack_c0 + 0.0;
        fStack_13c = local_98 * fVar43 + fStack_94 * fVar36 + fStack_90 * fVar44 + 0.0;
        pAVar25 = InstanceArray::getObject(this_02,uVar29);
        auVar38 = minps((undefined1  [16])(pAVar25->super_AccelData).bounds.bounds0.lower.field_0,
                        (undefined1  [16])(pAVar25->super_AccelData).bounds.bounds1.lower.field_0);
        auVar33 = maxps((undefined1  [16])(pAVar25->super_AccelData).bounds.bounds0.upper.field_0,
                        (undefined1  [16])(pAVar25->super_AccelData).bounds.bounds1.upper.field_0);
        fVar52 = auVar38._0_4_;
        fVar48 = auVar38._4_4_;
        fVar36 = auVar38._8_4_;
        fVar37 = fVar36 * local_68 + local_148;
        fVar42 = fVar36 * fStack_64 + fStack_144;
        fVar43 = fVar36 * fStack_60 + fStack_140;
        fVar44 = fVar36 * fStack_5c + fStack_13c;
        fVar53 = fVar48 * local_58 + fVar37;
        fVar54 = fVar48 * fStack_54 + fVar42;
        fVar55 = fVar48 * fStack_50 + fVar43;
        fVar56 = fVar48 * fStack_4c + fVar44;
        fVar49 = fVar52 * local_48;
        fVar50 = fVar52 * fStack_44;
        fVar51 = fVar52 * fStack_40;
        fVar52 = fVar52 * fStack_3c;
        auVar59._0_4_ = fVar49 + fVar53;
        auVar59._4_4_ = fVar50 + fVar54;
        auVar59._8_4_ = fVar51 + fVar55;
        auVar59._12_4_ = fVar52 + fVar56;
        auVar38 = minps(_DAT_01f45a30,auVar59);
        auVar31 = maxps((undefined1  [16])_DAT_01f45a40,auVar59);
        fVar36 = auVar33._0_4_;
        fVar32 = auVar33._4_4_;
        fVar65 = auVar33._8_4_;
        fVar61 = fVar65 * local_68 + local_148;
        fVar62 = fVar65 * fStack_64 + fStack_144;
        fVar63 = fVar65 * fStack_60 + fStack_140;
        fVar64 = fVar65 * fStack_5c + fStack_13c;
        fVar45 = fVar48 * local_58 + fVar61;
        fVar46 = fVar48 * fStack_54 + fVar62;
        fVar47 = fVar48 * fStack_50 + fVar63;
        fVar48 = fVar48 * fStack_4c + fVar64;
        auVar60._0_4_ = fVar49 + fVar45;
        auVar60._4_4_ = fVar50 + fVar46;
        auVar60._8_4_ = fVar51 + fVar47;
        auVar60._12_4_ = fVar52 + fVar48;
        auVar38 = minps(auVar38,auVar60);
        auVar31 = maxps(auVar31,auVar60);
        fVar37 = fVar37 + fVar32 * local_58;
        fVar42 = fVar42 + fVar32 * fStack_54;
        fVar43 = fVar43 + fVar32 * fStack_50;
        fVar44 = fVar44 + fVar32 * fStack_4c;
        fVar65 = fVar49 + fVar37;
        fVar66 = fVar50 + fVar42;
        fVar67 = fVar51 + fVar43;
        fVar68 = fVar52 + fVar44;
        auVar22._4_4_ = fVar66;
        auVar22._0_4_ = fVar65;
        auVar22._8_4_ = fVar67;
        auVar22._12_4_ = fVar68;
        auVar38 = minps(auVar38,auVar22);
        auVar23._4_4_ = fVar66;
        auVar23._0_4_ = fVar65;
        auVar23._8_4_ = fVar67;
        auVar23._12_4_ = fVar68;
        auVar31 = maxps(auVar31,auVar23);
        fVar61 = fVar32 * local_58 + fVar61;
        fVar62 = fVar32 * fStack_54 + fVar62;
        fVar63 = fVar32 * fStack_50 + fVar63;
        fVar64 = fVar32 * fStack_4c + fVar64;
        fVar49 = fVar49 + fVar61;
        fVar50 = fVar50 + fVar62;
        fVar51 = fVar51 + fVar63;
        fVar52 = fVar52 + fVar64;
        auVar33._4_4_ = fVar50;
        auVar33._0_4_ = fVar49;
        auVar33._8_4_ = fVar51;
        auVar33._12_4_ = fVar52;
        auVar38 = minps(auVar38,auVar33);
        auVar15._4_4_ = fVar50;
        auVar15._0_4_ = fVar49;
        auVar15._8_4_ = fVar51;
        auVar15._12_4_ = fVar52;
        auVar33 = maxps(auVar31,auVar15);
        fVar32 = fVar36 * local_48;
        fVar65 = fVar36 * fStack_44;
        fVar52 = fVar36 * fStack_40;
        fVar36 = fVar36 * fStack_3c;
        fVar53 = fVar53 + fVar32;
        fVar54 = fVar54 + fVar65;
        fVar55 = fVar55 + fVar52;
        fVar56 = fVar56 + fVar36;
        auVar18._4_4_ = fVar54;
        auVar18._0_4_ = fVar53;
        auVar18._8_4_ = fVar55;
        auVar18._12_4_ = fVar56;
        auVar31 = minps(auVar38,auVar18);
        auVar19._4_4_ = fVar54;
        auVar19._0_4_ = fVar53;
        auVar19._8_4_ = fVar55;
        auVar19._12_4_ = fVar56;
        auVar33 = maxps(auVar33,auVar19);
        fVar45 = fVar45 + fVar32;
        fVar46 = fVar46 + fVar65;
        fVar47 = fVar47 + fVar52;
        fVar48 = fVar48 + fVar36;
        auVar38._4_4_ = fVar46;
        auVar38._0_4_ = fVar45;
        auVar38._8_4_ = fVar47;
        auVar38._12_4_ = fVar48;
        auVar38 = minps(auVar31,auVar38);
        auVar31._4_4_ = fVar46;
        auVar31._0_4_ = fVar45;
        auVar31._8_4_ = fVar47;
        auVar31._12_4_ = fVar48;
        auVar31 = maxps(auVar33,auVar31);
        auVar40._0_4_ = fVar37 + fVar32;
        auVar40._4_4_ = fVar42 + fVar65;
        auVar40._8_4_ = fVar43 + fVar52;
        auVar40._12_4_ = fVar44 + fVar36;
        auVar38 = minps(auVar38,auVar40);
        auVar31 = maxps(auVar31,auVar40);
        auVar35._0_4_ = fVar32 + fVar61;
        auVar35._4_4_ = fVar65 + fVar62;
        auVar35._8_4_ = fVar52 + fVar63;
        auVar35._12_4_ = fVar36 + fVar64;
        in_XMM0 = minps(auVar38,auVar35);
        in_XMM1 = maxps(auVar31,auVar35);
      }
      else {
        if (RVar5 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
          pcVar9 = pRVar8->ptr_ofs;
          lVar27 = pRVar8->stride * uVar29;
          fStack_104 = *(float *)(pcVar9 + lVar27 + 0x10);
          local_108 = *(float *)(pcVar9 + lVar27);
          local_118 = *(float *)(pcVar9 + lVar27 + 4);
          local_128 = *(float *)(pcVar9 + lVar27 + 8);
          local_138 = *(float *)(pcVar9 + lVar27 + 0xc);
          fStack_100 = *(float *)(pcVar9 + lVar27 + 0x20);
          fStack_fc = 0.0;
          fStack_114 = *(float *)(pcVar9 + lVar27 + 0x14);
          fStack_110 = *(float *)(pcVar9 + lVar27 + 0x24);
          fStack_10c = 0.0;
          fStack_124 = *(float *)(pcVar9 + lVar27 + 0x18);
          fStack_120 = *(float *)(pcVar9 + lVar27 + 0x28);
          fStack_11c = 0.0;
          fStack_134 = *(float *)(pcVar9 + lVar27 + 0x1c);
          fStack_130 = *(float *)(pcVar9 + lVar27 + 0x2c);
          fStack_12c = 0.0;
        }
        else if (RVar5 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
          pcVar9 = pRVar8->ptr_ofs;
          lVar27 = pRVar8->stride * uVar29;
          local_108 = *(float *)(pcVar9 + lVar27);
          fStack_104 = (float)*(undefined8 *)(pcVar9 + lVar27 + 4);
          fStack_100 = (float)((ulong)*(undefined8 *)(pcVar9 + lVar27 + 4) >> 0x20);
          fStack_fc = 0.0;
          local_118 = *(float *)(pcVar9 + lVar27 + 0xc);
          fStack_114 = (float)*(undefined8 *)(pcVar9 + lVar27 + 0x10);
          fStack_110 = (float)((ulong)*(undefined8 *)(pcVar9 + lVar27 + 0x10) >> 0x20);
          fStack_10c = 0.0;
          local_128 = *(float *)(pcVar9 + lVar27 + 0x18);
          fStack_124 = (float)*(undefined8 *)(pcVar9 + lVar27 + 0x1c);
          fStack_120 = (float)((ulong)*(undefined8 *)(pcVar9 + lVar27 + 0x1c) >> 0x20);
          fStack_11c = 0.0;
          local_138 = *(float *)(pcVar9 + lVar27 + 0x24);
          fStack_134 = (float)*(undefined8 *)(pcVar9 + lVar27 + 0x28);
          fStack_130 = (float)((ulong)*(undefined8 *)(pcVar9 + lVar27 + 0x28) >> 0x20);
          fStack_12c = 0.0;
        }
        else if (RVar5 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
          pcVar9 = pRVar8->ptr_ofs;
          lVar27 = pRVar8->stride * uVar29;
          local_128 = (float)*(undefined8 *)(pcVar9 + lVar27 + 0x10);
          fStack_124 = (float)((ulong)*(undefined8 *)(pcVar9 + lVar27 + 0x10) >> 0x20);
          local_108 = *(float *)(pcVar9 + lVar27);
          fStack_114 = *(float *)(pcVar9 + lVar27 + 4);
          fStack_120 = *(float *)(pcVar9 + lVar27 + 8);
          local_118 = *(float *)(pcVar9 + lVar27 + 0xc);
          fStack_104 = (float)*(undefined8 *)(pcVar9 + lVar27 + 0x34);
          fStack_100 = (float)((ulong)*(undefined8 *)(pcVar9 + lVar27 + 0x34) >> 0x20);
          local_138 = *(float *)(pcVar9 + lVar27 + 0x18);
          fStack_134 = (float)*(undefined8 *)(pcVar9 + lVar27 + 0x1c);
          fStack_130 = (float)((ulong)*(undefined8 *)(pcVar9 + lVar27 + 0x1c) >> 0x20);
          fStack_12c = *(float *)(pcVar9 + lVar27 + 0x24);
          fStack_fc = *(float *)(pcVar9 + lVar27 + 0x28);
          fStack_10c = *(float *)(pcVar9 + lVar27 + 0x2c);
          fVar36 = *(float *)(pcVar9 + lVar27 + 0x30);
          fVar65 = fVar36 * fVar36 +
                   fStack_10c * fStack_10c + fStack_12c * fStack_12c + fStack_fc * fStack_fc;
          auVar38 = rsqrtss(ZEXT416((uint)fVar65),ZEXT416((uint)fVar65));
          fVar32 = auVar38._0_4_;
          fStack_11c = fVar32 * fVar32 * fVar65 * -0.5 * fVar32 + fVar32 * 1.5;
          fStack_12c = fStack_12c * fStack_11c;
          fStack_fc = fStack_fc * fStack_11c;
          fStack_10c = fStack_10c * fStack_11c;
          fStack_11c = fStack_11c * fVar36;
          fStack_110 = *(float *)(pcVar9 + lVar27 + 0x3c);
        }
        else if (RVar5 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
          pcVar9 = pRVar8->ptr_ofs;
          lVar27 = pRVar8->stride * uVar29;
          pfVar2 = (float *)(pcVar9 + lVar27);
          local_108 = *pfVar2;
          fStack_104 = pfVar2[1];
          fStack_100 = pfVar2[2];
          fStack_fc = pfVar2[3];
          pfVar2 = (float *)(pcVar9 + lVar27 + 0x10);
          local_118 = *pfVar2;
          fStack_114 = pfVar2[1];
          fStack_110 = pfVar2[2];
          fStack_10c = pfVar2[3];
          pfVar2 = (float *)(pcVar9 + lVar27 + 0x20);
          local_128 = *pfVar2;
          fStack_124 = pfVar2[1];
          fStack_120 = pfVar2[2];
          fStack_11c = pfVar2[3];
          pfVar2 = (float *)(pcVar9 + lVar27 + 0x30);
          local_138 = *pfVar2;
          fStack_134 = pfVar2[1];
          fStack_130 = pfVar2[2];
          fStack_12c = pfVar2[3];
        }
        pAVar25 = InstanceArray::getObject(this_02,uVar29);
        auVar38 = minps((undefined1  [16])(pAVar25->super_AccelData).bounds.bounds0.lower.field_0,
                        (undefined1  [16])(pAVar25->super_AccelData).bounds.bounds1.lower.field_0);
        auVar33 = maxps((undefined1  [16])(pAVar25->super_AccelData).bounds.bounds0.upper.field_0,
                        (undefined1  [16])(pAVar25->super_AccelData).bounds.bounds1.upper.field_0);
        fVar52 = auVar38._0_4_;
        fVar48 = auVar38._4_4_;
        fVar36 = auVar38._8_4_;
        fVar37 = fVar36 * local_128 + local_138;
        fVar42 = fVar36 * fStack_124 + fStack_134;
        fVar43 = fVar36 * fStack_120 + fStack_130;
        fVar44 = fVar36 * fStack_11c + fStack_12c;
        fVar53 = fVar48 * local_118 + fVar37;
        fVar54 = fVar48 * fStack_114 + fVar42;
        fVar55 = fVar48 * fStack_110 + fVar43;
        fVar56 = fVar48 * fStack_10c + fVar44;
        fVar49 = fVar52 * local_108;
        fVar50 = fVar52 * fStack_104;
        fVar51 = fVar52 * fStack_100;
        fVar52 = fVar52 * fStack_fc;
        auVar57._0_4_ = fVar49 + fVar53;
        auVar57._4_4_ = fVar50 + fVar54;
        auVar57._8_4_ = fVar51 + fVar55;
        auVar57._12_4_ = fVar52 + fVar56;
        auVar38 = minps(_DAT_01f45a30,auVar57);
        auVar31 = maxps((undefined1  [16])_DAT_01f45a40,auVar57);
        fVar36 = auVar33._0_4_;
        fVar32 = auVar33._4_4_;
        fVar65 = auVar33._8_4_;
        fVar61 = fVar65 * local_128 + local_138;
        fVar62 = fVar65 * fStack_124 + fStack_134;
        fVar63 = fVar65 * fStack_120 + fStack_130;
        fVar64 = fVar65 * fStack_11c + fStack_12c;
        fVar45 = fVar48 * local_118 + fVar61;
        fVar46 = fVar48 * fStack_114 + fVar62;
        fVar47 = fVar48 * fStack_110 + fVar63;
        fVar48 = fVar48 * fStack_10c + fVar64;
        auVar58._0_4_ = fVar49 + fVar45;
        auVar58._4_4_ = fVar50 + fVar46;
        auVar58._8_4_ = fVar51 + fVar47;
        auVar58._12_4_ = fVar52 + fVar48;
        auVar38 = minps(auVar38,auVar58);
        auVar31 = maxps(auVar31,auVar58);
        fVar37 = fVar37 + fVar32 * local_118;
        fVar42 = fVar42 + fVar32 * fStack_114;
        fVar43 = fVar43 + fVar32 * fStack_110;
        fVar44 = fVar44 + fVar32 * fStack_10c;
        fVar65 = fVar49 + fVar37;
        fVar66 = fVar50 + fVar42;
        fVar67 = fVar51 + fVar43;
        fVar68 = fVar52 + fVar44;
        auVar20._4_4_ = fVar66;
        auVar20._0_4_ = fVar65;
        auVar20._8_4_ = fVar67;
        auVar20._12_4_ = fVar68;
        auVar38 = minps(auVar38,auVar20);
        auVar21._4_4_ = fVar66;
        auVar21._0_4_ = fVar65;
        auVar21._8_4_ = fVar67;
        auVar21._12_4_ = fVar68;
        auVar31 = maxps(auVar31,auVar21);
        fVar61 = fVar32 * local_118 + fVar61;
        fVar62 = fVar32 * fStack_114 + fVar62;
        fVar63 = fVar32 * fStack_110 + fVar63;
        fVar64 = fVar32 * fStack_10c + fVar64;
        fVar49 = fVar49 + fVar61;
        fVar50 = fVar50 + fVar62;
        fVar51 = fVar51 + fVar63;
        fVar52 = fVar52 + fVar64;
        auVar13._4_4_ = fVar50;
        auVar13._0_4_ = fVar49;
        auVar13._8_4_ = fVar51;
        auVar13._12_4_ = fVar52;
        auVar38 = minps(auVar38,auVar13);
        auVar14._4_4_ = fVar50;
        auVar14._0_4_ = fVar49;
        auVar14._8_4_ = fVar51;
        auVar14._12_4_ = fVar52;
        auVar31 = maxps(auVar31,auVar14);
        fVar32 = fVar36 * local_108;
        fVar65 = fVar36 * fStack_104;
        fVar52 = fVar36 * fStack_100;
        fVar36 = fVar36 * fStack_fc;
        fVar53 = fVar53 + fVar32;
        fVar54 = fVar54 + fVar65;
        fVar55 = fVar55 + fVar52;
        fVar56 = fVar56 + fVar36;
        auVar16._4_4_ = fVar54;
        auVar16._0_4_ = fVar53;
        auVar16._8_4_ = fVar55;
        auVar16._12_4_ = fVar56;
        auVar38 = minps(auVar38,auVar16);
        auVar17._4_4_ = fVar54;
        auVar17._0_4_ = fVar53;
        auVar17._8_4_ = fVar55;
        auVar17._12_4_ = fVar56;
        auVar31 = maxps(auVar31,auVar17);
        fVar45 = fVar45 + fVar32;
        fVar46 = fVar46 + fVar65;
        fVar47 = fVar47 + fVar52;
        fVar48 = fVar48 + fVar36;
        auVar11._4_4_ = fVar46;
        auVar11._0_4_ = fVar45;
        auVar11._8_4_ = fVar47;
        auVar11._12_4_ = fVar48;
        auVar38 = minps(auVar38,auVar11);
        auVar12._4_4_ = fVar46;
        auVar12._0_4_ = fVar45;
        auVar12._8_4_ = fVar47;
        auVar12._12_4_ = fVar48;
        auVar31 = maxps(auVar31,auVar12);
        auVar39._0_4_ = fVar37 + fVar32;
        auVar39._4_4_ = fVar42 + fVar65;
        auVar39._8_4_ = fVar43 + fVar52;
        auVar39._12_4_ = fVar44 + fVar36;
        auVar38 = minps(auVar38,auVar39);
        auVar31 = maxps(auVar31,auVar39);
        auVar34._0_4_ = fVar32 + fVar61;
        auVar34._4_4_ = fVar65 + fVar62;
        auVar34._8_4_ = fVar52 + fVar63;
        auVar34._12_4_ = fVar36 + fVar64;
        in_XMM0 = minps(auVar38,auVar34);
        in_XMM1 = maxps(auVar31,auVar34);
      }
    }
    local_b8 = minps(local_b8,in_XMM0);
    local_a8.m128 = (__m128)maxps(local_a8.m128,in_XMM1);
    uVar6 = this->geomID_;
    *(uint *)(pcVar30 + uVar28 * 8) = uVar4;
    *(uint *)(pcVar30 + uVar28 * 8 + 4) = uVar6;
  }
  uVar28 = 7;
  if (local_158 < 7) {
    uVar28 = local_158;
  }
  aVar41._0_12_ = local_b8._0_12_;
  aVar41.m128[3] = (float)(local_f0->_end - local_f0->_begin);
  (local_e8->ref).ptr = uVar28 | (ulong)pcVar30 | 8;
  (local_e8->bounds).lower.field_0 = aVar41;
  (local_e8->bounds).upper.field_0 = local_a8;
  return local_e8;
}

Assistant:

operator() (const range<unsigned>& current, const FastAllocator::CachedAllocator& alloc)
      {
        vfloat4 lower(pos_inf);
        vfloat4 upper(neg_inf);
        size_t items = current.size();
        size_t start = current.begin();
        assert(items <= 1);

        /* allocate leaf node */
        InstanceArrayPrimitive* accel = (InstanceArrayPrimitive*) alloc.malloc1(items*sizeof(InstanceArrayPrimitive),BVH::byteAlignment);
        NodeRef ref = BVH::encodeLeaf((char*)accel,items);
        const InstanceArray* instance = this->mesh;

        BBox3fa bounds = empty;
        for (size_t i=0; i<items; i++)
        {
          const unsigned int primID = morton[start+i].index;
          bounds.extend(instance->bounds(primID));
          new (&accel[i]) InstanceArrayPrimitive(geomID_, primID);
        }

        BBox3fx box_o = (BBox3fx&)bounds;
#if ROTATE_TREE
        if (N == 4)
          box_o.lower.a = current.size();
#endif
        return NodeRecord(ref,box_o);
      }